

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void poly1305_process(mbedtls_poly1305_context *ctx,size_t nblocks,uchar *input,
                     uint32_t needs_padding)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint32_t uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uchar *puVar17;
  ulong uVar18;
  bool bVar19;
  
  uVar3 = (ulong)ctx->r[0];
  uVar7 = ctx->r[1];
  uVar5 = (ulong)uVar7;
  uVar1 = ctx->r[2];
  uVar2 = ctx->r[3];
  uVar15 = (ulong)((uVar7 >> 2) + uVar7);
  uVar6 = (ulong)((uVar1 >> 2) + uVar1);
  uVar4 = (ulong)((uVar2 >> 2) + uVar2);
  uVar9 = (ulong)ctx->acc[0];
  uVar10 = (ulong)ctx->acc[1];
  uVar12 = (ulong)ctx->acc[2];
  uVar11 = (ulong)ctx->acc[3];
  puVar17 = input + 0xf;
  uVar8 = ctx->acc[4];
  while( true ) {
    bVar19 = nblocks == 0;
    nblocks = nblocks - 1;
    if (bVar19) break;
    uVar9 = (uVar9 & 0xffffffff) + (ulong)*(uint *)(puVar17 + -0xf);
    uVar13 = uVar9 & 0xffffffff;
    uVar9 = (uVar9 >> 0x20) + (uVar10 & 0xffffffff) + (ulong)*(uint *)(puVar17 + -0xb);
    uVar18 = uVar9 & 0xffffffff;
    uVar9 = (uVar9 >> 0x20) + (uVar12 & 0xffffffff) + (ulong)*(uint *)(puVar17 + -7);
    uVar16 = uVar9 & 0xffffffff;
    uVar9 = (uVar9 >> 0x20) + (uVar11 & 0xffffffff) + (ulong)*(uint *)(puVar17 + -3);
    uVar14 = uVar9 & 0xffffffff;
    uVar7 = uVar8 + needs_padding + (int)(uVar9 >> 0x20);
    uVar9 = (ulong)uVar7;
    uVar10 = uVar14 * uVar15 + uVar16 * uVar6 + uVar18 * uVar4 + uVar13 * uVar3;
    uVar11 = (uVar10 >> 0x20) +
             uVar9 * uVar15 + uVar14 * uVar6 + uVar16 * uVar4 + uVar18 * uVar3 + uVar13 * uVar5;
    uVar12 = (uVar11 >> 0x20) +
             uVar9 * uVar6 + uVar14 * uVar4 + uVar16 * uVar3 + uVar18 * uVar5 + uVar13 * uVar1;
    uVar13 = (uVar12 >> 0x20) +
             uVar9 * uVar4 + uVar14 * uVar3 + uVar16 * uVar5 + uVar18 * uVar1 + uVar13 * uVar2;
    uVar7 = (int)(uVar13 >> 0x20) + uVar7 * ctx->r[0];
    uVar9 = (ulong)(uVar7 & 0xfffffffc) + (ulong)(uVar7 >> 2) + (uVar10 & 0xffffffff);
    uVar10 = (uVar9 >> 0x20) + (uVar11 & 0xffffffff);
    uVar12 = (uVar10 >> 0x20) + (uVar12 & 0xffffffff);
    uVar11 = (uVar12 >> 0x20) + (uVar13 & 0xffffffff);
    uVar8 = (int)(uVar11 >> 0x20) + (uVar7 & 3);
    puVar17 = puVar17 + 0x10;
  }
  ctx->acc[0] = (uint32_t)uVar9;
  ctx->acc[1] = (uint32_t)uVar10;
  ctx->acc[2] = (uint32_t)uVar12;
  ctx->acc[3] = (uint32_t)uVar11;
  ctx->acc[4] = uVar8;
  return;
}

Assistant:

static void poly1305_process( mbedtls_poly1305_context *ctx,
                              size_t nblocks,
                              const unsigned char *input,
                              uint32_t needs_padding )
{
    uint64_t d0, d1, d2, d3;
    uint32_t acc0, acc1, acc2, acc3, acc4;
    uint32_t r0, r1, r2, r3;
    uint32_t rs1, rs2, rs3;
    size_t offset  = 0U;
    size_t i;

    r0 = ctx->r[0];
    r1 = ctx->r[1];
    r2 = ctx->r[2];
    r3 = ctx->r[3];

    rs1 = r1 + ( r1 >> 2U );
    rs2 = r2 + ( r2 >> 2U );
    rs3 = r3 + ( r3 >> 2U );

    acc0 = ctx->acc[0];
    acc1 = ctx->acc[1];
    acc2 = ctx->acc[2];
    acc3 = ctx->acc[3];
    acc4 = ctx->acc[4];

    /* Process full blocks */
    for( i = 0U; i < nblocks; i++ )
    {
        /* The input block is treated as a 128-bit little-endian integer */
        d0   = BYTES_TO_U32_LE( input, offset + 0  );
        d1   = BYTES_TO_U32_LE( input, offset + 4  );
        d2   = BYTES_TO_U32_LE( input, offset + 8  );
        d3   = BYTES_TO_U32_LE( input, offset + 12 );

        /* Compute: acc += (padded) block as a 130-bit integer */
        d0  += (uint64_t) acc0;
        d1  += (uint64_t) acc1 + ( d0 >> 32U );
        d2  += (uint64_t) acc2 + ( d1 >> 32U );
        d3  += (uint64_t) acc3 + ( d2 >> 32U );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 += (uint32_t) ( d3 >> 32U ) + needs_padding;

        /* Compute: acc *= r */
        d0 = mul64( acc0, r0  ) +
             mul64( acc1, rs3 ) +
             mul64( acc2, rs2 ) +
             mul64( acc3, rs1 );
        d1 = mul64( acc0, r1  ) +
             mul64( acc1, r0  ) +
             mul64( acc2, rs3 ) +
             mul64( acc3, rs2 ) +
             mul64( acc4, rs1 );
        d2 = mul64( acc0, r2  ) +
             mul64( acc1, r1  ) +
             mul64( acc2, r0  ) +
             mul64( acc3, rs3 ) +
             mul64( acc4, rs2 );
        d3 = mul64( acc0, r3  ) +
             mul64( acc1, r2  ) +
             mul64( acc2, r1  ) +
             mul64( acc3, r0  ) +
             mul64( acc4, rs3 );
        acc4 *= r0;

        /* Compute: acc %= (2^130 - 5) (partial remainder) */
        d1 += ( d0 >> 32 );
        d2 += ( d1 >> 32 );
        d3 += ( d2 >> 32 );
        acc0 = (uint32_t) d0;
        acc1 = (uint32_t) d1;
        acc2 = (uint32_t) d2;
        acc3 = (uint32_t) d3;
        acc4 = (uint32_t) ( d3 >> 32 ) + acc4;

        d0 = (uint64_t) acc0 + ( acc4 >> 2 ) + ( acc4 & 0xFFFFFFFCU );
        acc4 &= 3U;
        acc0 = (uint32_t) d0;
        d0 = (uint64_t) acc1 + ( d0 >> 32U );
        acc1 = (uint32_t) d0;
        d0 = (uint64_t) acc2 + ( d0 >> 32U );
        acc2 = (uint32_t) d0;
        d0 = (uint64_t) acc3 + ( d0 >> 32U );
        acc3 = (uint32_t) d0;
        d0 = (uint64_t) acc4 + ( d0 >> 32U );
        acc4 = (uint32_t) d0;

        offset    += POLY1305_BLOCK_SIZE_BYTES;
    }

    ctx->acc[0] = acc0;
    ctx->acc[1] = acc1;
    ctx->acc[2] = acc2;
    ctx->acc[3] = acc3;
    ctx->acc[4] = acc4;
}